

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int is_nontrans_global_motion(MACROBLOCKD *xd,MB_MODE_INFO *mbmi)

{
  byte bVar1;
  int iVar2;
  MB_MODE_INFO *in_RSI;
  long in_RDI;
  int ref;
  int local_1c;
  int local_4;
  
  if ((in_RSI->mode == '\x0f') || (in_RSI->mode == '\x17')) {
    if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_RSI->bsize]
        < "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [in_RSI->bsize]) {
      bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [in_RSI->bsize];
    }
    else {
      bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [in_RSI->bsize];
    }
    if (bVar1 < 2) {
      local_4 = 0;
    }
    else {
      for (local_1c = 0; iVar2 = has_second_ref(in_RSI), local_1c < iVar2 + 1;
          local_1c = local_1c + 1) {
        if (*(char *)(*(long *)(in_RDI + 0x29f8) + (long)in_RSI->ref_frame[local_1c] * 0x24 + 0x20)
            == '\x01') {
          return 0;
        }
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int is_nontrans_global_motion(const MACROBLOCKD *xd,
                                            const MB_MODE_INFO *mbmi) {
  int ref;

  // First check if all modes are GLOBALMV
  if (mbmi->mode != GLOBALMV && mbmi->mode != GLOBAL_GLOBALMV) return 0;

  if (AOMMIN(mi_size_wide[mbmi->bsize], mi_size_high[mbmi->bsize]) < 2)
    return 0;

  // Now check if all global motion is non translational
  for (ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
    if (xd->global_motion[mbmi->ref_frame[ref]].wmtype == TRANSLATION) return 0;
  }
  return 1;
}